

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O0

QList<QAsn1Element> * __thiscall QAsn1Element::toList(QAsn1Element *this)

{
  ulong uVar1;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  char *in_RSI;
  QAsn1Element *in_RDI;
  long in_FS_OFFSET;
  QList<QAsn1Element> *items;
  QAsn1Element elem;
  QDataStream stream;
  undefined7 in_stack_ffffffffffffff68;
  quint8 in_stack_ffffffffffffff6f;
  QAsn1Element *this_00;
  QAsn1Element local_48;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  (in_RDI->mValue).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->mValue).d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QAsn1Element>::QList((QList<QAsn1Element> *)0x11bcf7);
  if (*in_RSI == '0') {
    local_48.mType = 0xaa;
    local_48._1_7_ = 0xaaaaaaaaaaaaaa;
    local_48.mValue.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_48.mValue.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_48.mValue.d.size = -0x5555555555555556;
    QByteArray::QByteArray((QByteArray *)0x11bd42);
    QAsn1Element(this_00,in_stack_ffffffffffffff6f,(QByteArray *)0x11bd53);
    QByteArray::~QByteArray((QByteArray *)0x11bd5d);
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QDataStream::QDataStream((QDataStream *)&local_28,(QByteArray *)(in_RSI + 8));
    __buf = extraout_RDX;
    while (uVar1 = read(&local_48,(int)&local_28,__buf,in_RCX), (uVar1 & 1) != 0) {
      QList<QAsn1Element>::operator<<
                ((QList<QAsn1Element> *)this_00,
                 (parameter_type)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      __buf = extraout_RDX_00;
    }
    QDataStream::~QDataStream((QDataStream *)&local_28);
    ~QAsn1Element((QAsn1Element *)0x11bde0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QAsn1Element> *)in_RDI;
}

Assistant:

QList<QAsn1Element> QAsn1Element::toList() const
{
    QList<QAsn1Element> items;
    if (mType == SequenceType) {
        QAsn1Element elem;
        QDataStream stream(mValue);
        while (elem.read(stream))
            items << elem;
    }
    return items;
}